

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepScanLineInputFile::setFrameBuffer
          (DeepScanLineInputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  pthread_mutex_t *__mutex;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  pointer __s;
  size_t sVar5;
  double dVar6;
  size_t sVar7;
  undefined4 uVar8;
  PixelType PVar9;
  undefined8 uVar10;
  int iVar11;
  ChannelList *this_00;
  const_iterator cVar12;
  ConstIterator CVar13;
  ConstIterator CVar14;
  const_iterator cVar15;
  Slice *pSVar16;
  pointer ppIVar17;
  ostream *poVar18;
  char *pcVar19;
  ArgExc *pAVar20;
  const_iterator cVar21;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  DeepFrameBuffer *__n;
  pointer ppIVar25;
  Data *pDVar26;
  bool bVar27;
  vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
  slices;
  value_type local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar11 = pthread_mutex_lock(__mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  this_00 = Header::channels(&this->_data->header);
  for (cVar12._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
      CVar13 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar12._M_node != CVar13._i._M_node;
      cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node)) {
    CVar14 = ChannelList::find(this_00,(char *)(cVar12._M_node + 1));
    cVar15._M_node = (_Base_ptr)ChannelList::end(this_00);
    if ((CVar14._i._M_node != (const_iterator)cVar15._M_node) &&
       ((*(_Rb_tree_color *)((long)CVar14._i._M_node + 0x124) != cVar12._M_node[10]._M_color ||
        (*(int *)((long)CVar14._i._M_node + 0x128) != *(int *)&cVar12._M_node[10].field_0x4)))) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"X and/or y subsampling factors of \"",0x23);
      poVar18 = std::operator<<((ostream *)&local_1a8,(char *)((long)CVar14._i._M_node + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" channel of input file \"",0x19)
      ;
      pcVar19 = IStream::fileName(this->_data->_streamData->is);
      poVar18 = std::operator<<(poVar18,pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"\" are not compatible with the frame buffer\'s subsampling factors.",0x41)
      ;
      pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)local_1b8);
      __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  pSVar16 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar16->base == (char *)0x0) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar26 = this->_data;
  pDVar26->sampleCountSliceBase = pSVar16->base;
  sVar7 = pSVar16->yStride;
  pDVar26->sampleCountXStride = (int)pSVar16->xStride;
  pDVar26->sampleCountYStride = (int)sVar7;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (pointer)0x0;
  cVar15._M_node = (_Base_ptr)ChannelList::begin(this_00);
  cVar12._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
  for (; CVar13 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar12._M_node != CVar13._i._M_node;
      cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node)) {
    while ((CVar14 = ChannelList::end(this_00), (const_iterator)cVar15._M_node != CVar14._i._M_node
           && (iVar11 = strcmp((char *)(cVar15._M_node + 1),(char *)(cVar12._M_node + 1)),
              iVar11 < 0))) {
      local_1c0 = (value_type)operator_new(0x48);
      _Var2 = cVar15._M_node[9]._M_color;
      local_1c0->typeInFrameBuffer = _Var2;
      local_1c0->typeInFile = _Var2;
      local_1c0->base = (char *)0x0;
      uVar3 = *(undefined8 *)&cVar15._M_node[9].field_0x4;
      local_1c0->sampleStride = 0;
      local_1c0->xPointerStride = 0;
      local_1c0->yPointerStride = 0;
      local_1c0->xSampling = (int)uVar3;
      local_1c0->ySampling = (int)((ulong)uVar3 >> 0x20);
      local_1c0->fill = false;
      local_1c0->skip = true;
      local_1c0->fillValue = 0.0;
      std::
      vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ::push_back((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
      cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
    }
    CVar14 = ChannelList::end(this_00);
    if (((const_iterator)cVar15._M_node == CVar14._i._M_node) ||
       (iVar11 = strcmp((char *)(cVar15._M_node + 1),(char *)(cVar12._M_node + 1)), 0 < iVar11)) {
      bVar27 = true;
    }
    else {
      bVar27 = false;
    }
    local_1c0 = (value_type)operator_new(0x48);
    cVar21._M_node = cVar15._M_node;
    if (bVar27 != false) {
      cVar21._M_node = cVar12._M_node;
    }
    p_Var4 = cVar12._M_node[9]._M_parent;
    _Var2 = cVar21._M_node[9]._M_color;
    iVar11 = *(int *)((long)&cVar12._M_node[10]._M_left + 4);
    p_Var1 = cVar12._M_node[10]._M_parent;
    local_1c0->typeInFrameBuffer = cVar12._M_node[9]._M_color;
    local_1c0->typeInFile = _Var2;
    local_1c0->base = (char *)p_Var4;
    p_Var4 = cVar12._M_node[9]._M_right;
    local_1c0->xPointerStride = (size_t)cVar12._M_node[9]._M_left;
    local_1c0->yPointerStride = (size_t)p_Var4;
    local_1c0->sampleStride = (long)iVar11;
    uVar8 = *(undefined4 *)&cVar12._M_node[10].field_0x4;
    local_1c0->xSampling = cVar12._M_node[10]._M_color;
    local_1c0->ySampling = uVar8;
    local_1c0->fill = bVar27;
    local_1c0->skip = false;
    local_1c0->fillValue = (double)p_Var1;
    std::
    vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
    ::push_back((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                 *)local_1b8,&local_1c0);
    CVar14 = ChannelList::end(this_00);
    if (bVar27 == false && (const_iterator)cVar15._M_node != CVar14._i._M_node) {
      cVar15._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar15._M_node);
    }
  }
  pDVar26 = this->_data;
  sVar23 = (pDVar26->gotSampleCount)._size;
  if (0 < (long)sVar23) {
    memset((pDVar26->gotSampleCount)._data,0,sVar23);
  }
  __s = (pDVar26->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)(pDVar26->bytesPerLine).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)__s;
  if (lVar22 != 0) {
    lVar22 = lVar22 >> 3;
    memset(__s,0,(lVar22 + (ulong)(lVar22 == 0)) * 8);
  }
  __n = frameBuffer;
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&pDVar26->frameBuffer,
              (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)frameBuffer);
  bVar27 = (frameBuffer->_sampleCounts).yTileCoords;
  (pDVar26->frameBuffer)._sampleCounts.xTileCoords = (frameBuffer->_sampleCounts).xTileCoords;
  (pDVar26->frameBuffer)._sampleCounts.yTileCoords = bVar27;
  PVar9 = (frameBuffer->_sampleCounts).type;
  uVar8 = *(undefined4 *)&(frameBuffer->_sampleCounts).field_0x4;
  pcVar19 = (frameBuffer->_sampleCounts).base;
  sVar7 = (frameBuffer->_sampleCounts).xStride;
  sVar5 = (frameBuffer->_sampleCounts).yStride;
  iVar11 = (frameBuffer->_sampleCounts).ySampling;
  dVar6 = (frameBuffer->_sampleCounts).fillValue;
  (pDVar26->frameBuffer)._sampleCounts.xSampling = (frameBuffer->_sampleCounts).xSampling;
  (pDVar26->frameBuffer)._sampleCounts.ySampling = iVar11;
  (pDVar26->frameBuffer)._sampleCounts.fillValue = dVar6;
  (pDVar26->frameBuffer)._sampleCounts.xStride = sVar7;
  (pDVar26->frameBuffer)._sampleCounts.yStride = sVar5;
  (pDVar26->frameBuffer)._sampleCounts.type = PVar9;
  *(undefined4 *)&(pDVar26->frameBuffer)._sampleCounts.field_0x4 = uVar8;
  (pDVar26->frameBuffer)._sampleCounts.base = pcVar19;
  pDVar26 = this->_data;
  ppIVar25 = (pDVar26->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppIVar17 = (pDVar26->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sVar23 = (long)ppIVar17 - (long)ppIVar25;
  if (sVar23 != 0) {
    uVar24 = 0;
    do {
      if (ppIVar25[uVar24] != (InSliceInfo_conflict *)0x0) {
        __n = (DeepFrameBuffer *)0x48;
        operator_delete(ppIVar25[uVar24],0x48);
      }
      uVar24 = uVar24 + 1;
      pDVar26 = this->_data;
      ppIVar25 = (pDVar26->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar17 = (pDVar26->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      sVar23 = (long)ppIVar17 - (long)ppIVar25;
    } while (uVar24 < (ulong)((long)sVar23 >> 3));
  }
  uVar3 = local_1b8._0_8_;
  uVar10 = local_1b8._8_8_;
  uVar24 = local_1b8._8_8_ - local_1b8._0_8_;
  if ((ulong)((long)(pDVar26->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar25) < uVar24) {
    ppIVar17 = std::
               _Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                              *)((long)uVar24 >> 3),(size_t)__n);
    if (uVar10 != uVar3) {
      memcpy(ppIVar17,(void *)uVar3,uVar24);
    }
    ppIVar25 = (pDVar26->slices).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppIVar25 != (pointer)0x0) {
      operator_delete(ppIVar25,(long)(pDVar26->slices).
                                     super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppIVar25);
    }
    (pDVar26->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppIVar17;
    (pDVar26->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppIVar17 + uVar24);
  }
  else {
    if (sVar23 < uVar24) {
      if (ppIVar17 != ppIVar25) {
        memmove(ppIVar25,(void *)local_1b8._0_8_,sVar23);
      }
      ppIVar25 = (pDVar26->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar17 = (pointer)(((long)ppIVar25 -
                           (long)(pDVar26->slices).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + local_1b8._0_8_);
      sVar23 = local_1b8._8_8_ - (long)ppIVar17;
      if (sVar23 == 0) goto LAB_001f228b;
    }
    else {
      sVar23 = uVar24;
      ppIVar17 = (pointer)local_1b8._0_8_;
      if (local_1b8._8_8_ == local_1b8._0_8_) goto LAB_001f228b;
    }
    memmove(ppIVar25,ppIVar17,sVar23);
  }
LAB_001f228b:
  (pDVar26->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar24 + (long)(pDVar26->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  this->_data->frameBufferValid = true;
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineInputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    
    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of input file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<InSliceInfo*> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new InSliceInfo (i.channel().type,
                                               NULL,
                                               i.channel().type,
                                               0,
                                               0,
                                               0, // sampleStride
                                               i.channel().xSampling,
                                               i.channel().ySampling,
                                               false,  // fill
                                               true, // skip
                                               0.0)); // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new InSliceInfo (j.slice().type,
                                           j.slice().base,
                                           fill? j.slice().type:
                                                 i.channel().type,
                                           j.slice().xStride,
                                           j.slice().yStride,
                                           j.slice().sampleStride,
                                           j.slice().xSampling,
                                           j.slice().ySampling,
                                           fill,
                                           false, // skip
                                           j.slice().fillValue));


        if (i != channels.end() && !fill)
            ++i;
    }

    //
    // Client may want data to be filled in multiple arrays,
    // so we reset gotSampleCount and bytesPerLine.
    //

    for (long i = 0; i < _data->gotSampleCount.size(); i++)
        _data->gotSampleCount[i] = false;
    for (size_t i = 0; i < _data->bytesPerLine.size(); i++)
        _data->bytesPerLine[i] = 0;

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
    _data->frameBufferValid = true;
}